

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeFeaturesTests.cpp
# Opt level: O2

void __thiscall agge::joins::tests::BevelJoinTests::OuterJoinIsBeveled(BevelJoinTests *this)

{
  point_r *ppVar1;
  point_r *rhs;
  real_t rVar2;
  real_t rVar3;
  allocator local_101;
  bevel j;
  points output;
  LocationInfo local_e0;
  string local_b8;
  point_r seq2 [3];
  point_r seq1 [3];
  point_r reference2 [4];
  point_r reference3 [2];
  point_r reference1 [2];
  
  ppVar1 = seq1 + 1;
  seq1[0].x = 3.1;
  seq1[0].y = 3.1;
  seq1[1].x = 7.1;
  seq1[1].y = 2.3;
  seq1[2].x = 17.2;
  seq1[2].y = 3.1;
  seq2[0].x = 3.1;
  seq2[0].y = 3.1;
  seq2[1].x = 7.1;
  seq2[1].y = 9.3;
  seq2[2].x = 3.7;
  seq2[2].y = 16.5;
  pod_vector<agge::point<float>_>::pod_vector(&output,0);
  j.super_join._vptr_join = (join)&PTR__join_001d52d8;
  rVar2 = distance(seq1,ppVar1);
  rhs = seq1 + 2;
  rVar3 = distance(ppVar1,rhs);
  bevel::calc(&j,&output,1.0,seq1,rVar2,ppVar1,rVar3,rhs);
  reference1[0].x = 6.90388;
  reference1[0].y = 1.31942;
  reference1[1].x = 7.17896;
  reference1[1].y = 1.30312;
  std::__cxx11::string::string
            ((string *)reference2,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeFeaturesTests.cpp"
             ,(allocator *)&local_b8);
  ut::LocationInfo::LocationInfo(&local_e0,(string *)reference2,0x2a);
  ut::are_equal<agge::point<float>,2ul,agge::pod_vector<agge::point<float>>>
            (&reference1,&output,&local_e0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  rVar2 = distance(seq1,ppVar1);
  rVar3 = distance(ppVar1,rhs);
  bevel::calc(&j,&output,1.75,seq1,rVar2,ppVar1,rVar3,rhs);
  reference2[2].x = 6.7568;
  reference2[2].y = 0.583984;
  reference2[3].x = 7.23818;
  reference2[3].y = 0.555464;
  reference2[0].x = 6.90388;
  reference2[0].y = 1.31942;
  reference2[1].x = 7.17896;
  reference2[1].y = 1.30312;
  std::__cxx11::string::string
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeFeaturesTests.cpp"
             ,(allocator *)reference3);
  ut::LocationInfo::LocationInfo(&local_e0,&local_b8,0x37);
  ut::are_equal<agge::point<float>,4ul,agge::pod_vector<agge::point<float>>>
            (&reference2,&output,&local_e0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  output._end = output._begin;
  ppVar1 = seq2 + 1;
  rVar2 = distance(seq2,ppVar1);
  rVar3 = distance(ppVar1,seq2 + 2);
  bevel::calc(&j,&output,1.75,seq2,rVar2,ppVar1,rVar3,seq2 + 2);
  reference3[0].x = 8.57052;
  reference3[0].y = 8.35128;
  reference3[1].x = 8.68244;
  reference3[1].y = 10.0473;
  std::__cxx11::string::string
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeFeaturesTests.cpp"
             ,&local_101);
  ut::LocationInfo::LocationInfo(&local_e0,&local_b8,0x45);
  ut::are_equal<agge::point<float>,2ul,agge::pod_vector<agge::point<float>>>
            (&reference3,&output,&local_e0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pod_vector<agge::point<float>_>::~pod_vector(&output);
  return;
}

Assistant:

test( OuterJoinIsBeveled )
				{
					// INIT
					const point_r seq1[] = {
						{ 3.1f, 3.1f },
						{ 7.1f, 2.3f },
						{ 17.2f, 3.1f },
					};
					const point_r seq2[] = {
						{ 3.1f, 3.1f },
						{ 7.1f, 9.3f },
						{ 3.7f, 16.5f },
					};
					points output;
					bevel j;

					// ACT
					j.calc(output, 1.0f, seq1[0], distance(seq1[0], seq1[1]), seq1[1], distance(seq1[1], seq1[2]), seq1[2]);

					// ASSERT
					point_r reference1[] = {
						{ 6.90388f, 1.31942f },
						{ 7.17896f, 1.30312f },
					};

					assert_equal(reference1, output);

					// ACT
					j.calc(output, 1.75f, seq1[0], distance(seq1[0], seq1[1]), seq1[1], distance(seq1[1], seq1[2]), seq1[2]);

					// ASSERT
					point_r reference2[] = {
						{ 6.90388f, 1.31942f },
						{ 7.17896f, 1.30312f },
						{ 6.75680f, 0.583984f },
						{ 7.23818f, 0.555464f },
					};

					assert_equal(reference2, output);

					// INIT
					output.clear();

					// ACT
					j.calc(output, 1.75f, seq2[0], distance(seq2[0], seq2[1]), seq2[1], distance(seq2[1], seq2[2]), seq2[2]);

					// ASSERT
					point_r reference3[] = {
						{ 8.57052f, 8.35128f },
						{ 8.68244f, 10.0473f },
					};

					assert_equal(reference3, output);
				}